

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void pybind11::detail::all_type_info_populate
               (PyTypeObject *t,
               vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               *bases)

{
  long *plVar1;
  type_info *ptVar2;
  tuple_iterator tVar3;
  internals *piVar4;
  const_iterator cVar5;
  pointer pptVar6;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range5;
  sequence_fast_readonly sVar7;
  size_t i;
  ulong uVar8;
  long *plVar9;
  _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  type_info *tinfo;
  value_type type;
  vector<_typeobject_*,_std::allocator<_typeobject_*>_> check;
  handle local_68;
  handle local_60;
  _Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_> local_58;
  _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  _typeobject *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_ptr = t->tp_bases;
  if (local_60.m_ptr != (PyObject *)0x0) {
    (local_60.m_ptr)->ob_refcnt = (local_60.m_ptr)->ob_refcnt + 1;
  }
  sVar7.ptr = (PyObject **)&local_60.m_ptr[1].ob_type;
  if (((local_60.m_ptr)->ob_type->tp_flags & 0x2000000) != 0) {
    sVar7.ptr = (PyObject **)*sVar7.ptr;
  }
  tVar3 = tuple::end((tuple *)&local_60);
  for (; (sequence_fast_readonly)sVar7.ptr != tVar3.super_sequence_fast_readonly.ptr;
      sVar7.ptr = sVar7.ptr + 1) {
    local_68.m_ptr = *sVar7.ptr;
    std::vector<_typeobject*,std::allocator<_typeobject*>>::emplace_back<_typeobject*>
              ((vector<_typeobject*,std::allocator<_typeobject*>> *)&local_58,
               (_typeobject **)&local_68);
  }
  object::~object((object *)&local_60);
  piVar4 = get_internals();
  this = &(piVar4->registered_types_py)._M_h;
  uVar8 = 0;
  local_40 = this;
  do {
    if ((ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar8) {
      std::_Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>::~_Vector_base(&local_58);
      return;
    }
    local_60.m_ptr = (PyObject *)local_58._M_impl.super__Vector_impl_data._M_start[uVar8];
    if ((((((_typeobject *)local_60.m_ptr)->ob_base).ob_base.ob_type)->tp_flags & 0x80000000) != 0)
    {
      cVar5 = std::
              _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this,(key_type *)&local_60);
      if (cVar5.
          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        ptVar2 = (type_info *)local_60.m_ptr[0x15].ob_refcnt;
        if (ptVar2 != (type_info *)0x0) {
          if (uVar8 + 1 ==
              (long)local_58._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3) {
            local_58._M_impl.super__Vector_impl_data._M_finish =
                 local_58._M_impl.super__Vector_impl_data._M_finish + -1;
            uVar8 = uVar8 - 1;
          }
          ptVar2->type = (PyTypeObject *)((long)&(ptVar2->type->ob_base).ob_base.ob_refcnt + 1);
          sVar7.ptr = (PyObject **)&ptVar2->holder_size_in_ptrs;
          if ((((PyTypeObject *)ptVar2->cpptype)->tp_flags & 0x2000000) != 0) {
            sVar7.ptr = (PyObject **)*sVar7.ptr;
          }
          local_68.m_ptr = (PyObject *)ptVar2;
          tVar3 = tuple::end((tuple *)&local_68);
          for (; (sequence_fast_readonly)sVar7.ptr != tVar3.super_sequence_fast_readonly.ptr;
              sVar7.ptr = sVar7.ptr + 1) {
            local_38 = (_typeobject *)*sVar7.ptr;
            std::vector<_typeobject*,std::allocator<_typeobject*>>::emplace_back<_typeobject*>
                      ((vector<_typeobject*,std::allocator<_typeobject*>> *)&local_58,&local_38);
          }
          object::~object((object *)&local_68);
          this = local_40;
        }
      }
      else {
        plVar1 = *(long **)((long)cVar5.
                                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                  ._M_cur + 0x18);
        for (plVar9 = *(long **)((long)cVar5.
                                       super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                       ._M_cur + 0x10); this = local_40, plVar9 != plVar1;
            plVar9 = plVar9 + 1) {
          local_68.m_ptr = (PyObject *)*plVar9;
          pptVar6 = (bases->
                    super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          do {
            if (pptVar6 ==
                (bases->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::push_back(bases,(value_type *)&local_68);
              break;
            }
            ptVar2 = *pptVar6;
            pptVar6 = pptVar6 + 1;
          } while (ptVar2 != (type_info *)local_68.m_ptr);
        }
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

PYBIND11_NOINLINE inline void all_type_info_populate(PyTypeObject *t, std::vector<type_info *> &bases) {
    std::vector<PyTypeObject *> check;
    for (handle parent : reinterpret_borrow<tuple>(t->tp_bases))
        check.push_back((PyTypeObject *) parent.ptr());

    auto const &type_dict = get_internals().registered_types_py;
    for (size_t i = 0; i < check.size(); i++) {
        auto type = check[i];
        // Ignore Python2 old-style class super type:
        if (!PyType_Check((PyObject *) type)) continue;

        // Check `type` in the current set of registered python types:
        auto it = type_dict.find(type);
        if (it != type_dict.end()) {
            // We found a cache entry for it, so it's either pybind-registered or has pre-computed
            // pybind bases, but we have to make sure we haven't already seen the type(s) before: we
            // want to follow Python/virtual C++ rules that there should only be one instance of a
            // common base.
            for (auto *tinfo : it->second) {
                // NB: Could use a second set here, rather than doing a linear search, but since
                // having a large number of immediate pybind11-registered types seems fairly
                // unlikely, that probably isn't worthwhile.
                bool found = false;
                for (auto *known : bases) {
                    if (known == tinfo) { found = true; break; }
                }
                if (!found) bases.push_back(tinfo);
            }
        }
        else if (type->tp_bases) {
            // It's some python type, so keep follow its bases classes to look for one or more
            // registered types
            if (i + 1 == check.size()) {
                // When we're at the end, we can pop off the current element to avoid growing
                // `check` when adding just one base (which is typical--.e. when there is no
                // multiple inheritance)
                check.pop_back();
                i--;
            }
            for (handle parent : reinterpret_borrow<tuple>(type->tp_bases))
                check.push_back((PyTypeObject *) parent.ptr());
        }
    }
}